

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

void on_read(uv_stream_t *pipe,ssize_t nread,uv_buf_t *rdbuf)

{
  int iVar1;
  uv_buf_t uVar2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  char *local_60;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_40 [4];
  int r;
  uv_buf_t wrbuf;
  uv_write_t *req;
  uv_buf_t *rdbuf_local;
  ssize_t nread_local;
  uv_stream_t *pipe_local;
  
  if ((nread < 1) && (nread != -0xfff)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
            ,0x66,"nread > 0 || nread == UV_EOF");
    abort();
  }
  if ((0 < nread) && (output_used = output_used + (int)nread, output_used % 0xc == 0)) {
    iVar1 = memcmp("hello world\n",output,0xc);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
              ,0x6b,"memcmp(\"hello world\\n\", output, 12)","==","0",(long)iVar1,"==",0);
      abort();
    }
    uVar2 = uv_buf_init(output,0xc);
    eval_a_1 = (int64_t)uVar2.base;
    _auStack_40 = (char *)eval_a_1;
    local_60 = (char *)uVar2.len;
    wrbuf.base = local_60;
    wrbuf.len = (size_t)malloc(200);
    iVar1 = uv_write((uv_write_t *)wrbuf.len,(uv_stream_t *)&in,(uv_buf_t *)auStack_40,1,after_write
                    );
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
              ,0x6f,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
  }
  on_read_cb_called = on_read_cb_called + 1;
  return;
}

Assistant:

static void on_read(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* buf) {
  if (nread > 0) {
    output_used += nread;
  } else if (nread < 0) {
    ASSERT_EQ(nread, UV_EOF);
    uv_close((uv_handle_t*) tcp, close_cb);
  }
}